

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O1

void llvm::yaml::MappingTraits<llvm::DWARFYAML::InitialLength>::mapping
               (IO *IO,InitialLength *InitialLength)

{
  EmptyContext local_1a;
  EmptyContext local_19 [7];
  EmptyContext Ctx_1;
  EmptyContext Ctx;
  
  yaml::IO::processKey<unsigned_int,llvm::yaml::EmptyContext>
            (IO,"TotalLength",&InitialLength->TotalLength,true,local_19);
  if (InitialLength->TotalLength == 0xffffffff) {
    yaml::IO::processKey<unsigned_long,llvm::yaml::EmptyContext>
              (IO,"TotalLength64",&InitialLength->TotalLength64,true,&local_1a);
  }
  return;
}

Assistant:

void MappingTraits<DWARFYAML::InitialLength>::mapping(
    IO &IO, DWARFYAML::InitialLength &InitialLength) {
  IO.mapRequired("TotalLength", InitialLength.TotalLength);
  if (InitialLength.isDWARF64())
    IO.mapRequired("TotalLength64", InitialLength.TotalLength64);
}